

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditorImage::AnalyzeTileFlags(CEditorImage *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uchar *__s;
  ulong uVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  
  __s = this->m_aTileFlags;
  if ((this->super_CImageInfo).m_Format == 0) {
    memset(__s,4,0x100);
    return;
  }
  mem_zero(__s,0x100);
  iVar1 = (this->super_CImageInfo).m_Width;
  iVar5 = iVar1 + 0xf;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  iVar2 = (this->super_CImageInfo).m_Height;
  uVar6 = iVar5 >> 4;
  iVar5 = iVar2 + 0xf;
  if (-1 < iVar2) {
    iVar5 = iVar2;
  }
  if (uVar6 == iVar5 >> 4) {
    pvVar4 = (this->super_CImageInfo).m_pData;
    iVar5 = 0;
    lVar9 = 0;
    lVar12 = 0;
    do {
      lVar12 = (long)(int)lVar12;
      iVar13 = 0;
      iVar7 = 0;
      do {
        if (iVar1 < 0x10) {
LAB_00192a46:
          __s[lVar12] = __s[lVar12] | 4;
        }
        else {
          iVar3 = (this->super_CImageInfo).m_Width;
          bVar11 = true;
          uVar14 = 0;
LAB_001929fd:
          iVar10 = (iVar5 * iVar3 + iVar13 + uVar14) * 4 + 3;
          do {
            uVar8 = (ulong)uVar6;
            iVar15 = iVar10;
            if (0xf < iVar2) {
              do {
                if (*(byte *)((long)pvVar4 + (long)iVar15) < 0xfa) {
                  uVar14 = uVar14 + 1;
                  bVar11 = false;
                  if (uVar14 == uVar6) goto LAB_00192a50;
                  goto LAB_001929fd;
                }
                iVar15 = iVar15 + iVar3 * 4;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
            uVar14 = uVar14 + 1;
            iVar10 = iVar10 + 4;
          } while (uVar14 != uVar6);
          if (bVar11) goto LAB_00192a46;
        }
LAB_00192a50:
        iVar7 = iVar7 + 1;
        lVar12 = lVar12 + 1;
        iVar13 = iVar13 + uVar6;
      } while (iVar7 != 0x10);
      lVar9 = lVar9 + 1;
      iVar5 = iVar5 + uVar6;
    } while (lVar9 != 0x10);
  }
  return;
}

Assistant:

void CEditorImage::AnalyzeTileFlags()
{
	if(m_Format == CImageInfo::FORMAT_RGB)
	{
		for(int i = 0; i < 256; ++i)
			m_aTileFlags[i] = TILEFLAG_OPAQUE;
	}
	else
	{
		mem_zero(m_aTileFlags, sizeof(m_aTileFlags));

		int tw = m_Width/16; // tilesizes
		int th = m_Height/16;
		if(tw == th)
		{
			unsigned char *pPixelData = (unsigned char *)m_pData;

			int TileID = 0;
			for(int ty = 0; ty < 16; ty++)
				for(int tx = 0; tx < 16; tx++, TileID++)
				{
					bool Opaque = true;
					for(int x = 0; x < tw; x++)
						for(int y = 0; y < th; y++)
						{
							int p = (ty*tw+y)*m_Width + tx*tw+x;
							if(pPixelData[p*4+3] < 250)
							{
								Opaque = false;
								break;
							}
						}

					if(Opaque)
						m_aTileFlags[TileID] |= TILEFLAG_OPAQUE;
				}
		}
	}
}